

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

void __thiscall
wabt::(anonymous_namespace)::RemoveEscapes<std::back_insert_iterator<std::__cxx11::string>>
          (_anonymous_namespace_ *this,string_view text,
          back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          dest)

{
  char cVar1;
  char *__value;
  bool bVar2;
  size_type sVar3;
  const_pointer pcVar4;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pbVar5;
  bool local_d5;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c0;
  byte local_b1;
  Enum local_b0;
  Enum local_ac;
  uint32_t local_a8;
  uint32_t local_a4;
  uint32_t lo;
  uint32_t hi;
  value_type local_91;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  value_type local_81;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  value_type local_71;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  value_type local_61;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  value_type local_51;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  value_type local_41;
  const_pointer local_40;
  char *end;
  char *src;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  dest_local;
  string_view text_local;
  
  local_20.container =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)text.size_;
  dest_local.container = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  sVar3 = string_view::size((string_view *)&dest_local);
  if (2 < sVar3) {
    sVar3 = string_view::size((string_view *)&dest_local);
    _src = string_view::substr((string_view *)&dest_local,1,sVar3 - 2);
    dest_local.container = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)src;
    end = string_view::data((string_view *)&dest_local);
    pcVar4 = string_view::data((string_view *)&dest_local);
    sVar3 = string_view::size((string_view *)&dest_local);
    local_40 = pcVar4 + sVar3;
    while (__value = end, end < local_40) {
      if (*end == '\\') {
        end = end + 1;
        cVar1 = *end;
        if (cVar1 == '\"') {
          local_91 = '\"';
          _lo = std::
                back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator++(&local_20,0);
          pbVar5 = std::
                   back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*((back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&lo);
          std::
          back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator=(pbVar5,&local_91);
        }
        else if (cVar1 == '\'') {
          local_81 = '\'';
          local_90 = std::
                     back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator++(&local_20,0);
          pbVar5 = std::
                   back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_90);
          std::
          back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator=(pbVar5,&local_81);
        }
        else if (cVar1 == '\\') {
          local_71 = '\\';
          local_80 = std::
                     back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator++(&local_20,0);
          pbVar5 = std::
                   back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_80);
          std::
          back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator=(pbVar5,&local_71);
        }
        else if (cVar1 == 'n') {
          local_41 = '\n';
          local_50 = std::
                     back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator++(&local_20,0);
          pbVar5 = std::
                   back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_50);
          std::
          back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator=(pbVar5,&local_41);
        }
        else if (cVar1 == 'r') {
          local_51 = '\r';
          local_60 = std::
                     back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator++(&local_20,0);
          pbVar5 = std::
                   back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_60);
          std::
          back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator=(pbVar5,&local_51);
        }
        else if (cVar1 == 't') {
          local_61 = '\t';
          local_70 = std::
                     back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator++(&local_20,0);
          pbVar5 = std::
                   back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_70);
          std::
          back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator=(pbVar5,&local_61);
        }
        else {
          local_ac = (Enum)ParseHexdigit(*end,&local_a4);
          bVar2 = Succeeded((Result)local_ac);
          local_d5 = false;
          if (bVar2) {
            local_b0 = (Enum)ParseHexdigit(end[1],&local_a8);
            local_d5 = Succeeded((Result)local_b0);
          }
          if (local_d5 == false) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/wast-parser.cc"
                          ,0x58,
                          "void wabt::(anonymous namespace)::RemoveEscapes(string_view, OutputIter) [OutputIter = std::back_insert_iterator<std::basic_string<char>>]"
                         );
          }
          local_b1 = (byte)(local_a4 << 4) | (byte)local_a8;
          local_c0 = std::
                     back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator++(&local_20,0);
          pbVar5 = std::
                   back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_c0);
          std::
          back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator=(pbVar5,(value_type *)&local_b1);
          end = end + 1;
        }
        end = end + 1;
      }
      else {
        end = end + 1;
        local_c8 = std::
                   back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator++(&local_20,0);
        pbVar5 = std::
                 back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_c8);
        std::
        back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator=(pbVar5,__value);
      }
    }
  }
  return;
}

Assistant:

void RemoveEscapes(string_view text, OutputIter dest) {
  // Remove surrounding quotes; if any. This may be empty if the string was
  // invalid (e.g. if it contained a bad escape sequence).
  if (text.size() <= 2) {
    return;
  }

  text = text.substr(1, text.size() - 2);

  const char* src = text.data();
  const char* end = text.data() + text.size();

  while (src < end) {
    if (*src == '\\') {
      src++;
      switch (*src) {
        case 'n':
          *dest++ = '\n';
          break;
        case 'r':
          *dest++ = '\r';
          break;
        case 't':
          *dest++ = '\t';
          break;
        case '\\':
          *dest++ = '\\';
          break;
        case '\'':
          *dest++ = '\'';
          break;
        case '\"':
          *dest++ = '\"';
          break;
        default: {
          // The string should be validated already, so we know this is a hex
          // sequence.
          uint32_t hi;
          uint32_t lo;
          if (Succeeded(ParseHexdigit(src[0], &hi)) &&
              Succeeded(ParseHexdigit(src[1], &lo))) {
            *dest++ = (hi << 4) | lo;
          } else {
            assert(0);
          }
          src++;
          break;
        }
      }
      src++;
    } else {
      *dest++ = *src++;
    }
  }
}